

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_minimize_assumptions2(sat_solver3 *s,int *pLits,int nLits,int nConfLimit)

{
  ABC_INT64_T AVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint nLits_00;
  bool bVar9;
  int LitNot_2;
  int LitNot_1;
  int LitNot;
  int local_3c;
  int local_38;
  int local_34;
  
  if (nLits == 1) {
    local_34 = Abc_LitNot(*pLits);
    AVar1 = s->nConfLimit;
    s->nConfLimit = (long)nConfLimit;
    iVar2 = sat_solver3_push(s,local_34);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                    ,0x89e,"int sat_solver3_minimize_assumptions2(sat_solver3 *, int *, int, int)");
    }
    iVar2 = sat_solver3_solve_internal(s);
    sat_solver3_pop(s);
    if ((iVar2 == -1) &&
       (iVar3 = sat_solver3_addclause(s,&local_34,(lit *)&stack0xffffffffffffffd0), iVar3 == 0)) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                    ,0x8a6,"int sat_solver3_minimize_assumptions2(sat_solver3 *, int *, int, int)");
    }
    s->nConfLimit = (long)(int)AVar1;
    uVar4 = (uint)(iVar2 != -1);
  }
  else {
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                    ,0x8ac,"int sat_solver3_minimize_assumptions2(sat_solver3 *, int *, int, int)");
    }
    nLits_00 = (uint)nLits >> 1;
    uVar5 = (ulong)nLits_00;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      iVar2 = sat_solver3_push(s,pLits[uVar8]);
      if (iVar2 == 0) {
        uVar6 = (int)uVar8 + 1;
        for (uVar5 = uVar8 & 0xffffffff; -1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          sat_solver3_pop(s);
        }
        while (nLits_00 < uVar6) {
          local_38 = Abc_LitNot(pLits[uVar8]);
          iVar2 = sat_solver3_addclause(s,&local_38,&local_34);
          if (iVar2 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                          ,0x8bb,
                          "int sat_solver3_minimize_assumptions2(sat_solver3 *, int *, int, int)");
          }
        }
        goto LAB_006f7917;
      }
    }
    uVar4 = sat_solver3_minimize_assumptions2(s,pLits + uVar5,nLits - nLits_00,nConfLimit);
    uVar6 = nLits_00;
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      sat_solver3_pop(s);
    }
    veci_resize(&s->temp_clause,0);
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      veci_push(&s->temp_clause,pLits[uVar8]);
    }
    uVar8 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pLits[uVar8] = (pLits + uVar5)[uVar8];
    }
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      (pLits + (int)uVar4)[uVar8] = (s->temp_clause).ptr[uVar8];
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      iVar2 = sat_solver3_push(s,pLits[uVar8]);
      if (iVar2 == 0) {
        uVar6 = (int)uVar8 + 1;
        for (uVar5 = uVar8 & 0xffffffff; -1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          sat_solver3_pop(s);
        }
        while ((int)uVar4 < (int)uVar6) {
          local_3c = Abc_LitNot(pLits[uVar8]);
          iVar2 = sat_solver3_addclause(s,&local_3c,&local_38);
          if (iVar2 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                          ,0x8d9,
                          "int sat_solver3_minimize_assumptions2(sat_solver3 *, int *, int, int)");
          }
        }
LAB_006f7917:
        iVar2 = sat_solver3_minimize_assumptions2(s,pLits,uVar6,nConfLimit);
        return iVar2;
      }
    }
    iVar2 = sat_solver3_minimize_assumptions2(s,pLits + (int)uVar4,nLits_00,nConfLimit);
    while (iVar3 = (int)uVar7, uVar7 = (ulong)(iVar3 - 1), iVar3 != 0) {
      sat_solver3_pop(s);
    }
    uVar4 = iVar2 + uVar4;
  }
  return uVar4;
}

Assistant:

int sat_solver3_minimize_assumptions2( sat_solver3* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int RetValue = 1, LitNot = Abc_LitNot(pLits[0]);
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;

        RetValue = sat_solver3_push( s, LitNot ); assert( RetValue );
        status = sat_solver3_solve_internal( s );
        sat_solver3_pop( s );

        // if the problem is UNSAT, add clause
        if ( status == l_False )
        {
            RetValue = sat_solver3_addclause( s, &LitNot, &LitNot+1 );
            assert( RetValue );
        }

        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);

            // add clauses for these literal
            for ( k = i+1; k > nLitsL; k++ )
            {
                int LitNot = Abc_LitNot(pLits[i]);
                int RetValue = sat_solver3_addclause( s, &LitNot, &LitNot+1 );
                assert( RetValue );
            }

            return sat_solver3_minimize_assumptions2( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver3_minimize_assumptions2( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver3_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);

            // add clauses for these literal
            for ( k = i+1; k > nResL; k++ )
            {
                int LitNot = Abc_LitNot(pLits[i]);
                int RetValue = sat_solver3_addclause( s, &LitNot, &LitNot+1 );
                assert( RetValue );
            }

            return sat_solver3_minimize_assumptions2( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver3_minimize_assumptions2( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver3_pop(s);
    return nResL + nResR;
}